

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImGuiWindow_conflict *pIVar2;
  float *pfVar3;
  int iVar4;
  ImGuiContext_conflict1 *pIVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  ImGuiContext_conflict1 *ctx;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_50;
  
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  fVar10 = (GImGui->Style).ItemInnerSpacing.x;
  fVar11 = (float)(int)((w_full - fVar10 * (float)(components + -1)) / (float)components);
  local_50 = 1.0;
  fVar12 = 1.0;
  if (1.0 <= fVar11) {
    fVar12 = fVar11;
  }
  fVar10 = (float)(int)(w_full - (fVar10 + fVar12) * (float)(components + -1));
  iVar9 = (pIVar2->DC).ItemWidthStack.Size;
  if (iVar9 == (pIVar2->DC).ItemWidthStack.Capacity) {
    if (iVar9 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar9 / 2 + iVar9;
    }
    iVar6 = iVar9 + 1;
    if (iVar9 + 1 < iVar8) {
      iVar6 = iVar8;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
    pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
    if (pfVar3 != (float *)0x0) {
      memcpy(pfVar7,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
      pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
      if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
    }
    (pIVar2->DC).ItemWidthStack.Data = pfVar7;
    (pIVar2->DC).ItemWidthStack.Capacity = iVar6;
    iVar9 = (pIVar2->DC).ItemWidthStack.Size;
  }
  else {
    pfVar7 = (pIVar2->DC).ItemWidthStack.Data;
  }
  if (1.0 <= fVar10) {
    local_50 = fVar10;
  }
  pfVar7[iVar9] = (pIVar2->DC).ItemWidth;
  iVar8 = (pIVar2->DC).ItemWidthStack.Size;
  iVar9 = iVar8 + 1;
  (pIVar2->DC).ItemWidthStack.Size = iVar9;
  if (iVar9 == (pIVar2->DC).ItemWidthStack.Capacity) {
    iVar8 = iVar8 + 2;
    if (iVar9 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar9 / 2 + iVar9;
    }
    if (iVar8 < iVar9) {
      iVar8 = iVar9;
    }
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
    if (pfVar3 != (float *)0x0) {
      memcpy(pfVar7,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
      pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
      if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
    }
    (pIVar2->DC).ItemWidthStack.Data = pfVar7;
    (pIVar2->DC).ItemWidthStack.Capacity = iVar8;
    iVar9 = (pIVar2->DC).ItemWidthStack.Size;
  }
  else {
    pfVar7 = (pIVar2->DC).ItemWidthStack.Data;
  }
  pfVar7[iVar9] = local_50;
  iVar9 = (pIVar2->DC).ItemWidthStack.Size + 1;
  (pIVar2->DC).ItemWidthStack.Size = iVar9;
  if (2 < components) {
    iVar8 = components + -2;
    do {
      if (iVar9 == (pIVar2->DC).ItemWidthStack.Capacity) {
        if (iVar9 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar9 / 2 + iVar9;
        }
        iVar4 = iVar9 + 1;
        if (iVar9 + 1 < iVar6) {
          iVar4 = iVar6;
        }
        if (GImGui != (ImGuiContext_conflict1 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar4 << 2,GImAllocatorUserData);
        pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
        if (pfVar3 != (float *)0x0) {
          memcpy(pfVar7,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
          pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
          if ((pfVar3 != (float *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pfVar3,GImAllocatorUserData);
        }
        (pIVar2->DC).ItemWidthStack.Data = pfVar7;
        (pIVar2->DC).ItemWidthStack.Capacity = iVar4;
        iVar9 = (pIVar2->DC).ItemWidthStack.Size;
      }
      else {
        pfVar7 = (pIVar2->DC).ItemWidthStack.Data;
      }
      pfVar7[iVar9] = fVar12;
      iVar9 = (pIVar2->DC).ItemWidthStack.Size + 1;
      (pIVar2->DC).ItemWidthStack.Size = iVar9;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (components != 1) {
    local_50 = fVar12;
  }
  (pIVar2->DC).ItemWidth = local_50;
  *(byte *)&(pIVar5->NextItemData).Flags = (byte)(pIVar5->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 2; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = (components == 1) ? w_item_last : w_item_one;
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}